

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

void __thiscall SQFunctionProto::~SQFunctionProto(SQFunctionProto *this)

{
  ~SQFunctionProto(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

SQFunctionProto::~SQFunctionProto()
{
    REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
}